

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O2

int32_t __thiscall
icu_63::DictionaryBreakEngine::findBreaks
          (DictionaryBreakEngine *this,UText *text,int32_t startPos,int32_t endPos,
          UVector32 *foundBreaks)

{
  UBool UVar1;
  UChar32 c;
  int iVar2;
  int64_t iVar3;
  ulong uVar4;
  
  iVar3 = utext_getNativeIndex_63(text);
  c = utext_current32_63(text);
  while( true ) {
    uVar4 = utext_getNativeIndex_63(text);
    if (endPos <= (int)uVar4) break;
    UVar1 = UnicodeSet::contains(&this->fSet,c);
    if (UVar1 == '\0') break;
    utext_next32_63(text);
    c = utext_current32_63(text);
  }
  iVar2 = (*(this->super_LanguageBreakEngine)._vptr_LanguageBreakEngine[5])
                    (this,text,iVar3,uVar4 & 0xffffffff,foundBreaks);
  utext_setNativeIndex_63(text,(long)(int)uVar4);
  return iVar2;
}

Assistant:

int32_t
DictionaryBreakEngine::findBreaks( UText *text,
                                 int32_t startPos,
                                 int32_t endPos,
                                 UVector32 &foundBreaks ) const {
    (void)startPos;            // TODO: remove this param?
    int32_t result = 0;

    // Find the span of characters included in the set.
    //   The span to break begins at the current position in the text, and
    //   extends towards the start or end of the text, depending on 'reverse'.

    int32_t start = (int32_t)utext_getNativeIndex(text);
    int32_t current;
    int32_t rangeStart;
    int32_t rangeEnd;
    UChar32 c = utext_current32(text);
    while((current = (int32_t)utext_getNativeIndex(text)) < endPos && fSet.contains(c)) {
        utext_next32(text);         // TODO:  recast loop for postincrement
        c = utext_current32(text);
    }
    rangeStart = start;
    rangeEnd = current;
    result = divideUpDictionaryRange(text, rangeStart, rangeEnd, foundBreaks);
    utext_setNativeIndex(text, current);
    
    return result;
}